

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O1

MusInfo * I_RegisterSong(FileReader *reader,MidiDeviceSetting *device)

{
  bool bVar1;
  int iVar2;
  EMidiDevice EVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var4;
  BYTE *pBVar5;
  undefined4 extraout_var_01;
  MemoryArrayReader *this;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *fmt;
  EMidiDevice type;
  int complen;
  ulong uVar6;
  char cVar7;
  DWORD subid;
  DWORD id [8];
  int local_5c;
  uint local_58;
  int local_54;
  int local_50;
  
  if (nomusic == 0) {
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,&local_58,0x20);
    if ((CONCAT44(extraout_var,iVar2) == 0x20) &&
       (iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])
                          (reader,0xffffffffffffffe0,1), CONCAT44(extraout_var_00,iVar2) == 0)) {
      this = (MemoryArrayReader *)reader;
      if ((local_58 & 0xffffff) == 0x88b1f) {
        complen = (int)reader->Length;
        uVar6 = (ulong)complen;
        pBVar5 = (BYTE *)operator_new__(uVar6);
        iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar5,uVar6);
        if (CONCAT44(extraout_var_01,iVar2) == uVar6) {
          (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])(reader);
          this = (MemoryArrayReader *)operator_new(0x40);
          MemoryArrayReader::MemoryArrayReader(this,(char *)0x0,0);
          bVar1 = ungzip(pBVar5,complen,&this->buf);
          operator_delete__(pBVar5);
          if (!bVar1) {
LAB_003349bc:
            pp_Var4 = (this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase;
            goto LAB_003349d2;
          }
          (this->super_FileReader).Length = (ulong)(this->buf).Count;
          iVar2 = (*(this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                            (this,&local_58,0x20);
          if ((CONCAT44(extraout_var_02,iVar2) != 0x20) ||
             (iVar2 = (*(this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
                                (this,0xffffffffffffffe0,1), CONCAT44(extraout_var_03,iVar2) != 0))
          goto LAB_003349bc;
          bVar1 = true;
        }
        else {
          operator_delete__(pBVar5);
          pp_Var4 = (reader->super_FileReaderBase)._vptr_FileReaderBase;
LAB_003349d2:
          (*pp_Var4[1])(this);
          bVar1 = false;
          this = (MemoryArrayReader *)reader;
        }
        if (!bVar1) {
          return (MusInfo *)0x0;
        }
      }
      iVar2 = MUSHeaderSearch((BYTE *)&local_58,0x20);
      cVar7 = '\x04';
      if (iVar2 < 0) {
        if ((int)local_58 < 0x4d494d48) {
          if (local_58 == 0x20544143) {
LAB_00334a93:
            cVar7 = '\x03';
            if (local_50 != 0x44494d58) goto LAB_00334aa3;
          }
          else if (((local_58 != 0x2d494d48) || (local_54 != 0x4944494d)) ||
                  (cVar7 = '\x02', local_50 != 0x474e4f53)) {
LAB_00334aa3:
            cVar7 = local_58 == 0x6468544d;
          }
        }
        else if ((local_58 != 0x4d494d48) || (cVar7 = '\x02', local_54 != 0x50494449)) {
          if (local_58 != 0x4d524f46) goto LAB_00334aa3;
          cVar7 = '\x03';
          if (local_50 != 0x52494458) goto LAB_00334a93;
        }
      }
      if (cVar7 == '\0') {
        if (((local_54 == 0x41544144 && local_58 == 0x41574152) ||
            (local_54 == 0x4c504f57 && local_58 == 0x41524244)) ||
           ((local_58 == 0x494c4441 && ((char)local_54 == 'B')))) {
          reader = (FileReader *)operator_new(0x20);
          if (device == (MidiDeviceSetting *)0x0) {
            pBVar5 = "";
          }
          else {
            pBVar5 = (BYTE *)(device->args).Chars;
          }
          OPLMUSSong::OPLMUSSong((OPLMUSSong *)reader,&this->super_FileReader,(char *)pBVar5);
        }
        else {
          fmt = GME_CheckFormat(0);
          if ((fmt == (char *)0x0) || (*fmt == '\0')) {
            reader = (FileReader *)MOD_OpenSong(&this->super_FileReader);
          }
          else {
            reader = (FileReader *)GME_OpenSong(&this->super_FileReader,fmt);
          }
        }
      }
      else {
        if (device == (MidiDeviceSetting *)0x0) {
          EVar3 = MDEV_DEFAULT;
        }
        else {
          EVar3 = device->device;
        }
        type = MDEV_SNDSYS;
        if (EVar3 != MDEV_MMAPI) {
          type = EVar3;
        }
        do {
          pBVar5 = "";
          if (device != (MidiDeviceSetting *)0x0) {
            pBVar5 = (BYTE *)(device->args).Chars;
          }
          switch(cVar7) {
          case '\x01':
            reader = (FileReader *)operator_new(0xcc8);
            MIDISong2::MIDISong2((MIDISong2 *)reader,&this->super_FileReader,type,(char *)pBVar5);
            break;
          case '\x02':
            reader = (FileReader *)operator_new(0xcd8);
            HMISong::HMISong((HMISong *)reader,&this->super_FileReader,type,(char *)pBVar5);
            break;
          case '\x03':
            reader = (FileReader *)operator_new(0xcd0);
            XMISong::XMISong((XMISong *)reader,&this->super_FileReader,type,(char *)pBVar5);
            break;
          case '\x04':
            reader = (FileReader *)operator_new(0xcc8);
            MUSSong2::MUSSong2((MUSSong2 *)reader,&this->super_FileReader,type,(char *)pBVar5);
            break;
          default:
            reader = (FileReader *)0x0;
          }
          if ((HMISong *)reader == (HMISong *)0x0) {
LAB_00334bf7:
            reader = (FileReader *)0x0;
          }
          else {
            iVar2 = (*(((HMISong *)reader)->super_MIDIStreamer).super_MusInfo._vptr_MusInfo[10])
                              (reader);
            if ((char)iVar2 == '\0') {
              (*(((HMISong *)reader)->super_MIDIStreamer).super_MusInfo._vptr_MusInfo[1])(reader);
              goto LAB_00334bf7;
            }
          }
        } while ((((HMISong *)reader == (HMISong *)0x0) && (type != MDEV_SNDSYS)) &&
                (type = MDEV_SNDSYS, snd_mididevice.Value < 0));
      }
      if ((HMISong *)reader == (HMISong *)0x0) {
        if (local_58 == 0x46464952) {
          (*(this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])(this,8,1);
          iVar2 = (*(this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                            (this,&local_5c,4);
          pp_Var4 = (this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase;
          if (CONCAT44(extraout_var_04,iVar2) == 4) {
            (*pp_Var4[4])(this,0xfffffffffffffff4,1);
            if (local_5c != 0x41444443) goto LAB_00334cb1;
            reader = (FileReader *)operator_new(0x18);
            CDDAFile::CDDAFile((CDDAFile *)reader,&this->super_FileReader);
          }
          else {
            (*pp_Var4[1])(this);
LAB_00334cb1:
            reader = (FileReader *)0x0;
          }
          if (CONCAT44(extraout_var_04,iVar2) != 4) {
            return (MusInfo *)0x0;
          }
        }
        else {
          reader = (FileReader *)0x0;
        }
        if ((HMISong *)reader == (HMISong *)0x0) {
          if (((this->super_FileReader).Length < 0x400) && (local_58 != 0x6468544d)) {
            reader = (FileReader *)0x0;
          }
          else {
            reader = (FileReader *)operator_new(0x18);
            StreamSong::StreamSong((StreamSong *)reader,&this->super_FileReader);
            this = (MemoryArrayReader *)0x0;
          }
        }
      }
      if (this != (MemoryArrayReader *)0x0) {
        (*(this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this);
      }
      if ((HMISong *)reader == (HMISong *)0x0) {
        return (MusInfo *)0x0;
      }
      iVar2 = (*(((HMISong *)reader)->super_MIDIStreamer).super_MusInfo._vptr_MusInfo[10])(reader);
      if ((char)iVar2 != '\0') {
        return (MusInfo *)(HMISong *)reader;
      }
      pp_Var4 = (((HMISong *)reader)->super_MIDIStreamer).super_MusInfo._vptr_MusInfo;
      goto LAB_003348e4;
    }
  }
  else if (reader == (FileReader *)0x0) {
    return (MusInfo *)0x0;
  }
  pp_Var4 = (reader->super_FileReaderBase)._vptr_FileReaderBase;
LAB_003348e4:
  (*pp_Var4[1])(reader);
  return (MusInfo *)0x0;
}

Assistant:

MusInfo *I_RegisterSong (FileReader *reader, MidiDeviceSetting *device)
{
	MusInfo *info = NULL;
	const char *fmt;
	DWORD id[32/4];

	if (nomusic)
	{
		delete reader;
		return 0;
	}

	if(reader->Read(id, 32) != 32 || reader->Seek(-32, SEEK_CUR) != 0)
	{
		delete reader;
		return 0;
	}

    // Check for gzip compression. Some formats are expected to have players
    // that can handle it, so it simplifies things if we make all songs
    // gzippable.
	if ((id[0] & MAKE_ID(255, 255, 255, 0)) == GZIP_ID)
	{
		int len = reader->GetLength();
		BYTE *gzipped = new BYTE[len];
		if (reader->Read(gzipped, len) != len)
		{
			delete[] gzipped;
			delete reader;
			return NULL;
		}
		delete reader;

		MemoryArrayReader *memreader = new MemoryArrayReader(NULL, 0);
		if (!ungzip(gzipped, len, memreader->GetArray()))
		{
			delete[] gzipped;
			delete memreader;
			return 0;
		}
		delete[] gzipped;
		memreader->UpdateLength();

		if (memreader->Read(id, 32) != 32 || memreader->Seek(-32, SEEK_CUR) != 0)
		{
			delete memreader;
			return 0;
		}
		reader = memreader;
	}

	EMIDIType miditype = IdentifyMIDIType(id, sizeof(id));
	if (miditype != MIDI_NOTMIDI)
	{
		EMidiDevice devtype = device == NULL? MDEV_DEFAULT : (EMidiDevice)device->device;
#ifndef _WIN32
		// non-Windows platforms don't support MDEV_MMAPI so map to MDEV_SNDSYS
		if (devtype == MDEV_MMAPI)
			devtype = MDEV_SNDSYS;
#endif

retry_as_sndsys:
		info = CreateMIDIStreamer(*reader, devtype, miditype, device != NULL? device->args.GetChars() : "");
		if (info != NULL && !info->IsValid())
		{
			delete info;
			info = NULL;
		}
		if (info == NULL && devtype != MDEV_SNDSYS && snd_mididevice < 0)
		{
			devtype = MDEV_SNDSYS;
			goto retry_as_sndsys;
		}
#ifdef _WIN32
		if (info == NULL && devtype != MDEV_MMAPI && snd_mididevice >= 0)
		{
			info = CreateMIDIStreamer(*reader, MDEV_MMAPI, miditype, "");
		}
#endif
	}

	// Check for various raw OPL formats
	else if (
		(id[0] == MAKE_ID('R','A','W','A') && id[1] == MAKE_ID('D','A','T','A')) ||		// Rdos Raw OPL
		(id[0] == MAKE_ID('D','B','R','A') && id[1] == MAKE_ID('W','O','P','L')) ||		// DosBox Raw OPL
		(id[0] == MAKE_ID('A','D','L','I') && *((BYTE *)id + 4) == 'B'))		// Martin Fernandez's modified IMF
	{
		info = new OPLMUSSong (*reader, device != NULL? device->args.GetChars() : "");
	}
	// Check for game music
	else if ((fmt = GME_CheckFormat(id[0])) != NULL && fmt[0] != '\0')
	{
		info = GME_OpenSong(*reader, fmt);
	}
	// Check for module formats
	else
	{
		info = MOD_OpenSong(*reader);
	}

    if (info == NULL)
    {
        // Check for CDDA "format"
        if (id[0] == (('R')|(('I')<<8)|(('F')<<16)|(('F')<<24)))
        {
            DWORD subid;

            reader->Seek(8, SEEK_CUR);
            if (reader->Read (&subid, 4) != 4)
            {
                delete reader;
                return 0;
            }
            reader->Seek(-12, SEEK_CUR);

            if (subid == (('C')|(('D')<<8)|(('D')<<16)|(('A')<<24)))
            {
                // This is a CDDA file
                info = new CDDAFile (*reader);
            }
        }

        // no support in sound system => no modules/streams
        // 1024 bytes is an arbitrary restriction. It's assumed that anything
        // smaller than this can't possibly be a valid music file if it hasn't
        // been identified already, so don't even bother trying to load it.
        // Of course MIDIs shorter than 1024 bytes should pass.
        if (info == NULL && (reader->GetLength() >= 1024 || id[0] == MAKE_ID('M','T','h','d')))
        {
            // Let the sound system figure out what it is.
            info = new StreamSong (reader);
			// Assumed ownership
			reader = NULL;
        }
    }

	if (reader != NULL) delete reader;

	if (info && !info->IsValid ())
	{
		delete info;
		info = NULL;
	}

	return info;
}